

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int cost_coeffs(MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,TXB_CTX *txb_ctx,
               int reduced_tx_set_used)

{
  int iVar1;
  int cost;
  TXB_CTX *in_stack_00000038;
  TX_TYPE in_stack_00000046;
  TX_SIZE in_stack_00000047;
  int in_stack_00000048;
  int in_stack_0000004c;
  MACROBLOCK *in_stack_00000050;
  int in_stack_00001730;
  
  iVar1 = av1_cost_coeffs_txb(in_stack_00000050,in_stack_0000004c,in_stack_00000048,
                              in_stack_00000047,in_stack_00000046,in_stack_00000038,
                              in_stack_00001730);
  return iVar1;
}

Assistant:

static inline int cost_coeffs(MACROBLOCK *x, int plane, int block,
                              TX_SIZE tx_size, const TX_TYPE tx_type,
                              const TXB_CTX *const txb_ctx,
                              int reduced_tx_set_used) {
#if TXCOEFF_COST_TIMER
  struct aom_usec_timer timer;
  aom_usec_timer_start(&timer);
#endif
  const int cost = av1_cost_coeffs_txb(x, plane, block, tx_size, tx_type,
                                       txb_ctx, reduced_tx_set_used);
#if TXCOEFF_COST_TIMER
  AV1_COMMON *tmp_cm = (AV1_COMMON *)&cpi->common;
  aom_usec_timer_mark(&timer);
  const int64_t elapsed_time = aom_usec_timer_elapsed(&timer);
  tmp_cm->txcoeff_cost_timer += elapsed_time;
  ++tmp_cm->txcoeff_cost_count;
#endif
  return cost;
}